

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O0

char * rapidxml::xml_document<char>::
       skip_and_expand_character_refs<rapidxml::xml_document<char>::attribute_value_pred<(char)34>,rapidxml::xml_document<char>::attribute_value_pure_pred<(char)34>,0>
                 (char **text)

{
  char cVar1;
  uchar uVar2;
  parse_error *this;
  unsigned_long uStack_38;
  uchar digit_1;
  unsigned_long code_1;
  unsigned_long uStack_28;
  uchar digit;
  unsigned_long code;
  char *dest;
  char *src;
  char **text_local;
  
  src = (char *)text;
  skip<rapidxml::xml_document<char>::attribute_value_pure_pred<(char)34>,0>(text);
  code = (unsigned_long)*(char **)src;
  dest = *(char **)src;
LAB_0020df28:
  uVar2 = attribute_value_pred<'"'>::test(*dest);
  if (uVar2 == '\0') {
    *(char **)src = dest;
    return (char *)code;
  }
  if (*dest == '&') {
    cVar1 = dest[1];
    if (cVar1 == '#') {
      if (dest[2] == 'x') {
        uStack_28 = 0;
        dest = dest + 3;
        while (internal::lookup_tables<0>::lookup_digits[(byte)*dest] != 0xff) {
          uStack_28 = uStack_28 * 0x10 +
                      (ulong)(byte)internal::lookup_tables<0>::lookup_digits[(byte)*dest];
          dest = dest + 1;
        }
        insert_coded_character<0>((char **)&code,uStack_28);
      }
      else {
        uStack_38 = 0;
        dest = dest + 2;
        while (internal::lookup_tables<0>::lookup_digits[(byte)*dest] != 0xff) {
          uStack_38 = uStack_38 * 10 +
                      (ulong)(byte)internal::lookup_tables<0>::lookup_digits[(byte)*dest];
          dest = dest + 1;
        }
        insert_coded_character<0>((char **)&code,uStack_38);
      }
      if (*dest != ';') {
        this = (parse_error *)__cxa_allocate_exception(0x18);
        parse_error::parse_error(this,"expected ;",dest);
        __cxa_throw(this,&parse_error::typeinfo,parse_error::~parse_error);
      }
      dest = dest + 1;
      goto LAB_0020df28;
    }
    if (cVar1 == 'a') {
      if (((dest[2] == 'm') && (dest[3] == 'p')) && (dest[4] == ';')) {
        *(undefined1 *)code = 0x26;
        code = code + 1;
        dest = dest + 5;
      }
      else {
        if (((dest[2] != 'p') || (dest[3] != 'o')) || ((dest[4] != 's' || (dest[5] != ';'))))
        goto LAB_0020e271;
        *(undefined1 *)code = 0x27;
        code = code + 1;
        dest = dest + 6;
      }
      goto LAB_0020df28;
    }
    if (cVar1 == 'g') {
      if ((dest[2] == 't') && (dest[3] == ';')) {
        *(undefined1 *)code = 0x3e;
        code = code + 1;
        dest = dest + 4;
        goto LAB_0020df28;
      }
    }
    else {
      if (cVar1 != 'l') {
        if ((((cVar1 != 'q') || (dest[2] != 'u')) || (dest[3] != 'o')) ||
           ((dest[4] != 't' || (dest[5] != ';')))) goto LAB_0020e271;
        *(undefined1 *)code = 0x22;
        code = code + 1;
        dest = dest + 6;
        goto LAB_0020df28;
      }
      if ((dest[2] == 't') && (dest[3] == ';')) {
        *(undefined1 *)code = 0x3c;
        code = code + 1;
        dest = dest + 4;
        goto LAB_0020df28;
      }
    }
  }
LAB_0020e271:
  *(char *)code = *dest;
  code = code + 1;
  dest = dest + 1;
  goto LAB_0020df28;
}

Assistant:

static Ch *skip_and_expand_character_refs(Ch *&text)
        {
            // If entity translation, whitespace condense and whitespace trimming is disabled, use plain skip
            if (Flags & parse_no_entity_translation && 
                !(Flags & parse_normalize_whitespace) &&
                !(Flags & parse_trim_whitespace))
            {
                skip<StopPred, Flags>(text);
                return text;
            }
            
            // Use simple skip until first modification is detected
            skip<StopPredPure, Flags>(text);

            // Use translation skip
            Ch *src = text;
            Ch *dest = src;
            while (StopPred::test(*src))
            {
                // If entity translation is enabled    
                if (!(Flags & parse_no_entity_translation))
                {
                    // Test if replacement is needed
                    if (src[0] == Ch('&'))
                    {
                        switch (src[1])
                        {

                        // &amp; &apos;
                        case Ch('a'): 
                            if (src[2] == Ch('m') && src[3] == Ch('p') && src[4] == Ch(';'))
                            {
                                *dest = Ch('&');
                                ++dest;
                                src += 5;
                                continue;
                            }
                            if (src[2] == Ch('p') && src[3] == Ch('o') && src[4] == Ch('s') && src[5] == Ch(';'))
                            {
                                *dest = Ch('\'');
                                ++dest;
                                src += 6;
                                continue;
                            }
                            break;

                        // &quot;
                        case Ch('q'): 
                            if (src[2] == Ch('u') && src[3] == Ch('o') && src[4] == Ch('t') && src[5] == Ch(';'))
                            {
                                *dest = Ch('"');
                                ++dest;
                                src += 6;
                                continue;
                            }
                            break;

                        // &gt;
                        case Ch('g'): 
                            if (src[2] == Ch('t') && src[3] == Ch(';'))
                            {
                                *dest = Ch('>');
                                ++dest;
                                src += 4;
                                continue;
                            }
                            break;

                        // &lt;
                        case Ch('l'): 
                            if (src[2] == Ch('t') && src[3] == Ch(';'))
                            {
                                *dest = Ch('<');
                                ++dest;
                                src += 4;
                                continue;
                            }
                            break;

                        // &#...; - assumes ASCII
                        case Ch('#'): 
                            if (src[2] == Ch('x'))
                            {
                                unsigned long code = 0;
                                src += 3;   // Skip &#x
                                while (1)
                                {
                                    unsigned char digit = internal::lookup_tables<0>::lookup_digits[static_cast<unsigned char>(*src)];
                                    if (digit == 0xFF)
                                        break;
                                    code = code * 16 + digit;
                                    ++src;
                                }
                                insert_coded_character<Flags>(dest, code);    // Put character in output
                            }
                            else
                            {
                                unsigned long code = 0;
                                src += 2;   // Skip &#
                                while (1)
                                {
                                    unsigned char digit = internal::lookup_tables<0>::lookup_digits[static_cast<unsigned char>(*src)];
                                    if (digit == 0xFF)
                                        break;
                                    code = code * 10 + digit;
                                    ++src;
                                }
                                insert_coded_character<Flags>(dest, code);    // Put character in output
                            }
                            if (*src == Ch(';'))
                                ++src;
                            else
                                RAPIDXML_PARSE_ERROR("expected ;", src);
                            continue;

                        // Something else
                        default:
                            // Ignore, just copy '&' verbatim
                            break;

                        }
                    }
                }
                
                // If whitespace condensing is enabled
                if (Flags & parse_normalize_whitespace)
                {
                    // Test if condensing is needed                 
                    if (whitespace_pred::test(*src))
                    {
                        *dest = Ch(' '); ++dest;    // Put single space in dest
                        ++src;                      // Skip first whitespace char
                        // Skip remaining whitespace chars
                        while (whitespace_pred::test(*src))
                            ++src;
                        continue;
                    }
                }

                // No replacement, only copy character
                *dest++ = *src++;

            }

            // Return new end
            text = src;
            return dest;

        }